

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi_load_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  int *data;
  int iVar1;
  uchar *puVar2;
  undefined1 local_108 [8];
  stbi__context s;
  
  data = &s.read_from_callbacks;
  s.io.skip = stbi__stdio_eof;
  s.img_n = 0x112d4d;
  s.img_out_n = 0;
  s.io.read._0_4_ = 0x112d68;
  s.io.read._4_4_ = 0;
  s.io_user_data = (void *)0x8000000001;
  s.io.eof = (_func_int_void_ptr *)f;
  s.img_buffer_end = (stbi_uc *)data;
  s.img_buffer_original._4_4_ = req_comp;
  iVar1 = stbi__stdio_read(f,(char *)data,0x80);
  if (iVar1 == 0) {
    s.img_buffer = (stbi_uc *)((long)&s.read_from_callbacks + 1);
    s.io_user_data = (void *)((ulong)s.io_user_data & 0xffffffff00000000);
    s.read_from_callbacks._0_1_ = 0;
  }
  else {
    s.img_buffer = (stbi_uc *)((long)iVar1 + (long)data);
  }
  s.buffer_start._120_8_ = data;
  puVar2 = stbi__load_flip((stbi__context *)local_108,x,y,comp,s.img_buffer_original._4_4_);
  if (puVar2 != (uchar *)0x0) {
    fseek((FILE *)f,(long)(s.buffer_start._120_4_ - (int)s.img_buffer),1);
  }
  return puVar2;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_flip(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}